

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.cpp
# Opt level: O0

Fp multiply(Fp *a,Fp *b)

{
  ulong uVar1;
  ulong uVar2;
  Fp FVar3;
  uint64_t tmp;
  uint64_t ah_bh;
  uint64_t al_bl;
  uint64_t al_bh;
  uint64_t ah_bl;
  uint64_t lomask;
  Fp *b_local;
  Fp *a_local;
  Fp fp;
  
  uVar1 = (ulong)*(uint *)((long)&a->frac + 4) * (ulong)(uint)b->frac;
  uVar2 = (ulong)(uint)a->frac * (ulong)*(uint *)((long)&b->frac + 4);
  FVar3.frac = (ulong)*(uint *)((long)&a->frac + 4) * (ulong)*(uint *)((long)&b->frac + 4) +
               (uVar1 >> 0x20) + (uVar2 >> 0x20) +
               ((uVar1 & 0xffffffff) + (uVar2 & 0xffffffff) +
                ((ulong)(uint)a->frac * (ulong)(uint)b->frac >> 0x20) + 0x80000000 >> 0x20);
  FVar3.exp = a->exp + 0x40 + b->exp;
  FVar3._12_4_ = 0;
  return FVar3;
}

Assistant:

static Fp multiply(Fp* a, Fp* b) {
  const uint64_t lomask = 0x00000000FFFFFFFF;

  uint64_t ah_bl = (a->frac >> 32) * (b->frac & lomask);
  uint64_t al_bh = (a->frac & lomask) * (b->frac >> 32);
  uint64_t al_bl = (a->frac & lomask) * (b->frac & lomask);
  uint64_t ah_bh = (a->frac >> 32) * (b->frac >> 32);

  uint64_t tmp = (ah_bl & lomask) + (al_bh & lomask) + (al_bl >> 32);
  /* round up */
  tmp += 1U << 31;

  Fp fp = {ah_bh + (ah_bl >> 32) + (al_bh >> 32) + (tmp >> 32),
           a->exp + b->exp + 64};

  return fp;
}